

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O1

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator+
          (TPZSFMatrix<long_double> *__return_storage_ptr__,TPZSFMatrix<long_double> *this,
          longdouble value)

{
  longdouble lVar1;
  int iVar2;
  undefined4 extraout_var;
  int extraout_var_00;
  longdouble *plVar3;
  longdouble *plVar4;
  longdouble *plVar5;
  
  iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  TPZSFMatrix(__return_storage_ptr__,CONCAT44(extraout_var,iVar2));
  plVar5 = __return_storage_ptr__->fElem;
  plVar4 = this->fElem;
  iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])(this);
  if (CONCAT44(extraout_var_00,iVar2) != 0 && -1 < extraout_var_00) {
    plVar3 = plVar4 + CONCAT44(extraout_var_00,iVar2);
    do {
      lVar1 = *plVar4;
      plVar4 = plVar4 + 1;
      *plVar5 = lVar1 + value;
      plVar5 = plVar5 + 1;
    } while (plVar4 < plVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

TPZSFMatrix<TVar> 
TPZSFMatrix<TVar> ::operator+(const TVar value ) const
{
	TPZSFMatrix<TVar>  res( this->Dim() );
	
	TVar *dst = res.fElem;
	TVar *src = fElem;
	TVar *end = &fElem[ Size() ];
	while ( src < end )
		*dst++ = (*src++) + value;
	
	return( res );
}